

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

int64_t duckdb::DatePart::TimezoneOperator::Operation<duckdb::interval_t,long>(interval_t input)

{
  NotImplementedException *this;
  allocator local_31;
  string local_30 [48];
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"\"interval\" units \"timezone\" not recognized",&local_31);
  duckdb::NotImplementedException::NotImplementedException(this,local_30);
  __cxa_throw(this,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

int64_t DatePart::TimezoneOperator::Operation(interval_t input) {
	throw NotImplementedException("\"interval\" units \"timezone\" not recognized");
}